

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::SetElementIWithCache<true>
               (Var receiver,RecyclableObject *object,RecyclableObject *index,Var value,
               PropertyRecordUsageCache *propertyRecordUsageCache,ScriptContext *scriptContext,
               PropertyOperationFlags flags,PropertyCacheOperationInfo *operationInfo)

{
  bool bVar1;
  uint32 index_00;
  PropertyId propertyKey;
  BOOL BVar2;
  undefined1 local_88 [4];
  PropertyId propId;
  PropertyValueInfo info;
  PropertyRecord *propertyRecord;
  ScriptContext *scriptContext_local;
  PropertyRecordUsageCache *propertyRecordUsageCache_local;
  Var value_local;
  RecyclableObject *index_local;
  RecyclableObject *object_local;
  Var receiver_local;
  
  bVar1 = TaggedNumber::Is(receiver);
  if (bVar1) {
    receiver_local._7_1_ =
         SetElementIOnTaggedNumber(receiver,object,index,value,scriptContext,flags);
  }
  else {
    info._56_8_ = PropertyRecordUsageCache::GetPropertyRecord(propertyRecordUsageCache);
    bVar1 = PropertyRecord::IsNumeric((PropertyRecord *)info._56_8_);
    if (bVar1) {
      index_00 = PropertyRecord::GetNumericValue((PropertyRecord *)info._56_8_);
      BVar2 = SetItem(receiver,object,index_00,value,scriptContext,flags,0);
      receiver_local._7_1_ = BVar2 != 0;
    }
    else {
      PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_88);
      if (((RecyclableObject *)receiver == object) &&
         (bVar1 = PropertyRecordUsageCache::TrySetPropertyFromCache<true>
                            (propertyRecordUsageCache,object,value,scriptContext,flags,
                             (PropertyValueInfo *)local_88,index,operationInfo), bVar1)) {
        receiver_local._7_1_ = true;
      }
      else {
        propertyKey = PropertyRecord::GetPropertyId((PropertyRecord *)info._56_8_);
        if ((propertyKey == 0x105) || (propertyKey == 0xba)) {
          BVar2 = SetProperty(receiver,object,propertyKey,value,scriptContext,flags);
          receiver_local._7_1_ = BVar2 != 0;
        }
        else {
          BVar2 = SetPropertyWPCache<int>
                            (receiver,object,propertyKey,value,scriptContext,flags,
                             (PropertyValueInfo *)local_88);
          receiver_local._7_1_ = BVar2 != 0;
        }
      }
    }
  }
  return receiver_local._7_1_;
}

Assistant:

bool JavascriptOperators::SetElementIWithCache(
        _In_ Var receiver,
        _In_ RecyclableObject* object,
        _In_ RecyclableObject* index,
        _In_ Var value,
        _In_ PropertyRecordUsageCache* propertyRecordUsageCache,
        _In_ ScriptContext* scriptContext,
        _In_ PropertyOperationFlags flags,
        _Inout_opt_ PropertyCacheOperationInfo* operationInfo)
    {
        if (TaggedNumber::Is(receiver))
        {
            return JavascriptOperators::SetElementIOnTaggedNumber(receiver, object, index, value, scriptContext, flags);
        }

        PropertyRecord const * propertyRecord = propertyRecordUsageCache->GetPropertyRecord();
        if (propertyRecord->IsNumeric())
        {
            return JavascriptOperators::SetItem(receiver, object, propertyRecord->GetNumericValue(), value, scriptContext, flags);
        }
        PropertyValueInfo info;
        if (receiver == object)
        {
            if (propertyRecordUsageCache->TrySetPropertyFromCache<ReturnOperationInfo>(object, value, scriptContext, flags, &info, index, operationInfo))
            {
                return true;
            }
        }
        PropertyId propId = propertyRecord->GetPropertyId();
        if (propId == PropertyIds::NaN || propId == PropertyIds::Infinity)
        {
            // As we no longer convert o[x] into o.x for NaN and Infinity, we need to follow SetProperty convention for these,
            // which would check for read-only properties, strict mode, etc.
            // Note that "-Infinity" does not qualify as property name, so we don't have to take care of it.
            return JavascriptOperators::SetProperty(receiver, object, propId, value, scriptContext, flags);
        }
        return JavascriptOperators::SetPropertyWPCache(receiver, object, propId, value, scriptContext, flags, &info);
    }